

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

AstNode * raviX_cast_to_integer(CompilerState *compiler_state,AstNode *subexpr)

{
  _Bool *p_Var1;
  uint uVar2;
  AstNode *pAVar3;
  
  uVar2 = subexpr->line_number;
  pAVar3 = (AstNode *)(*compiler_state->allocator->calloc)(compiler_state->allocator->arena,1,0x50);
  pAVar3->type = EXPR_UNARY;
  pAVar3->line_number = uVar2;
  (pAVar3->field_2).function_stmt.function_expr = subexpr;
  (pAVar3->field_2).unary_expr.unary_op = UNOPR_TO_INTEGER;
  p_Var1 = &(subexpr->field_2).embedded_C_stmt.is_decl;
  *p_Var1 = (_Bool)(*p_Var1 | 1);
  (pAVar3->field_2).common_expr.type.type_code = RAVI_TNUMINT;
  return pAVar3;
}

Assistant:

AstNode *raviX_cast_to_integer(CompilerState *compiler_state, AstNode *subexpr) {
	AstNode *expr = raviX_allocate_ast_node_at_line(compiler_state, EXPR_UNARY, subexpr->line_number);
	expr->unary_expr.expr = subexpr;
	expr->unary_expr.unary_op = UNOPR_TO_INTEGER;
	subexpr->common_expr.truncate_results = 1;
	set_typecode(&expr->common_expr.type, RAVI_TNUMINT);
	return expr;
}